

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp-inl.h
# Opt level: O0

Result __thiscall
wabt::interp::Memory::AtomicRmw<unsigned_int,unsigned_int(*&)(unsigned_int,unsigned_int)>
          (Memory *this,u64 offset,u64 addend,uint rhs,BinopFunc<unsigned_int,_unsigned_int> **func,
          uint *out)

{
  u64 addend_00;
  u64 offset_00;
  bool bVar1;
  Result RVar2;
  uint val;
  uint local_44;
  uint *puStack_40;
  uint lhs;
  uint *out_local;
  BinopFunc<unsigned_int,_unsigned_int> **func_local;
  u64 uStack_28;
  uint rhs_local;
  u64 addend_local;
  u64 offset_local;
  Memory *this_local;
  
  puStack_40 = out;
  out_local = (uint *)func;
  func_local._4_4_ = rhs;
  uStack_28 = addend;
  addend_local = offset;
  offset_local = (u64)this;
  RVar2 = AtomicLoad<unsigned_int>(this,offset,addend,&local_44);
  bVar1 = Failed(RVar2);
  offset_00 = addend_local;
  addend_00 = uStack_28;
  if (bVar1) {
    Result::Result((Result *)((long)&this_local + 4),Error);
  }
  else {
    val = (**(code **)out_local)(local_44,func_local._4_4_);
    RVar2 = AtomicStore<unsigned_int>(this,offset_00,addend_00,val);
    bVar1 = Failed(RVar2);
    if (bVar1) {
      Result::Result((Result *)((long)&this_local + 4),Error);
    }
    else {
      *puStack_40 = local_44;
      Result::Result((Result *)((long)&this_local + 4),Ok);
    }
  }
  return (Result)this_local._4_4_;
}

Assistant:

Result Memory::AtomicRmw(u64 offset, u64 addend, T rhs, F&& func, T* out) {
  T lhs;
  CHECK_RESULT(AtomicLoad(offset, addend, &lhs));
  CHECK_RESULT(AtomicStore(offset, addend, func(lhs, rhs)));
  *out = lhs;
  return Result::Ok;
}